

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,LIBSSH2_SFTP_ATTRIBUTES *attrs,int setstat)

{
  LIBSSH2_SFTP *sftp;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  ssize_t sVar7;
  char *pcVar8;
  ulong uVar9;
  size_t in_stack_ffffffffffffff88;
  uchar *s;
  char *local_60;
  LIBSSH2_SFTP_ATTRIBUTES *local_58;
  size_t data_len;
  char *local_48;
  char *local_40;
  time_t local_38;
  
  if (attrs == (LIBSSH2_SFTP_ATTRIBUTES *)0x0 || hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    iVar4 = -0x27;
  }
  else {
    local_58 = attrs;
    local_38 = time((time_t *)0x0);
    local_48 = "Unable to send FXP_FSETSTAT";
    if (setstat == 0) {
      local_48 = "Unable to send FXP_FSTAT command";
    }
    local_40 = hnd->handle;
    do {
      sftp = hnd->sftp;
      channel = sftp->channel;
      pLVar1 = channel->session;
      data_len = 0;
      sVar2 = hnd->handle_len;
      if (setstat == 0) {
        uVar9 = 0;
      }
      else {
        uVar3 = sftp_attrsize(local_58->flags);
        uVar9 = (ulong)uVar3;
      }
      local_60 = (char *)0x0;
      uVar9 = sVar2 + 0xd + uVar9;
      if (sftp->fstat_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        s = (uchar *)(*pLVar1->alloc)(uVar9 & 0xffffffff,&pLVar1->abstract);
        sftp->fstat_packet = s;
        if (s != (uchar *)0x0) {
          _libssh2_store_u32(&s,(int)uVar9 - 4);
          *s = (setstat != 0) * '\x02' | 8;
          uVar5 = sftp->request_id;
          sftp->request_id = uVar5 + 1;
          sftp->fstat_request_id = uVar5;
          s = s + 1;
          _libssh2_store_u32(&s,uVar5);
          _libssh2_store_str(&s,local_40,hnd->handle_len);
          if (setstat != 0) {
            sVar7 = sftp_attr2bin(s,local_58);
            s = s + sVar7;
          }
          sftp->fstat_state = libssh2_NB_state_created;
          goto LAB_00124511;
        }
        iVar4 = -6;
        pcVar8 = "Unable to allocate memory for FSTAT/FSETSTAT packet";
        s = (uchar *)0x0;
LAB_0012463f:
        iVar4 = _libssh2_error(pLVar1,iVar4,pcVar8);
LAB_00124649:
        if (iVar4 != -0x25) {
          return iVar4;
        }
      }
      else if (sftp->fstat_state == libssh2_NB_state_created) {
LAB_00124511:
        uVar6 = _libssh2_channel_write(channel,0,sftp->fstat_packet,uVar9 & 0xffffffff);
        if (uVar6 != 0xffffffffffffffdb) {
          (*pLVar1->free)(sftp->fstat_packet,&pLVar1->abstract);
          sftp->fstat_packet = (uchar *)0x0;
          if ((uVar9 & 0xffffffff) != uVar6) {
            sftp->fstat_state = libssh2_NB_state_idle;
            iVar4 = -7;
            pcVar8 = local_48;
            goto LAB_0012463f;
          }
          sftp->fstat_state = libssh2_NB_state_sent;
          goto LAB_0012455c;
        }
      }
      else {
LAB_0012455c:
        iVar4 = sftp_packet_requirev
                          (sftp,0x130a7e,(uchar *)(ulong)sftp->fstat_request_id,(uint32_t)&local_60,
                           (uchar **)&data_len,(size_t *)0x9,in_stack_ffffffffffffff88);
        if (iVar4 == 0) {
          sftp->fstat_state = libssh2_NB_state_idle;
          if (*local_60 == 'e') {
            uVar5 = _libssh2_ntohu32((uchar *)(local_60 + 5));
            (*pLVar1->free)(local_60,&pLVar1->abstract);
            if (uVar5 == 0) {
              return 0;
            }
            sftp->last_errno = uVar5;
            pcVar8 = "SFTP Protocol Error";
          }
          else {
            sVar7 = sftp_bin2attr(local_58,(uchar *)(local_60 + 5),data_len - 5);
            (*pLVar1->free)(local_60,&pLVar1->abstract);
            if (-1 < sVar7) {
              return 0;
            }
            pcVar8 = "Attributes too short in SFTP fstat";
          }
          iVar4 = _libssh2_error(pLVar1,-0x1f,pcVar8);
          goto LAB_00124649;
        }
        if (iVar4 != -0x25) {
          if (iVar4 == -0x26) {
            if (data_len != 0) {
              (*pLVar1->free)(local_60,&pLVar1->abstract);
            }
            iVar4 = -0x1f;
            pcVar8 = "SFTP fstat packet too short";
          }
          else {
            sftp->fstat_state = libssh2_NB_state_idle;
            pcVar8 = "Timeout waiting for status message";
          }
          goto LAB_0012463f;
        }
      }
      pLVar1 = hnd->sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar4 = _libssh2_wait_socket(pLVar1,local_38);
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,
                      LIBSSH2_SFTP_ATTRIBUTES *attrs, int setstat)
{
    int rc;
    if(!hnd || !attrs)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_fstat(hnd, attrs, setstat));
    return rc;
}